

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

EnumValue *
cppwinrt::get_attribute_value<winmd::reader::ElemSig::EnumValue>
          (EnumValue *__return_storage_ptr__,CustomAttribute *attribute,uint32_t arg)

{
  vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_> *this;
  const_reference signature;
  CustomAttributeSig local_48;
  uint32_t local_14;
  CustomAttribute *pCStack_10;
  uint32_t arg_local;
  CustomAttribute *attribute_local;
  
  local_14 = arg;
  pCStack_10 = attribute;
  winmd::reader::CustomAttribute::Value(&local_48,attribute);
  this = winmd::reader::CustomAttributeSig::FixedArgs(&local_48);
  signature = std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
              operator[](this,(ulong)local_14);
  get_attribute_value<winmd::reader::ElemSig::EnumValue>(__return_storage_ptr__,signature);
  winmd::reader::CustomAttributeSig::~CustomAttributeSig(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto get_attribute_value(CustomAttribute const& attribute, uint32_t const arg)
    {
        return get_attribute_value<T>(attribute.Value().FixedArgs()[arg]);
    }